

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::ReorganizeDataLayerParams::_InternalParse
          (ReorganizeDataLayerParams *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint64_t uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint64_t val;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  ReorganizeDataLayerParams *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  do {
    while( true ) {
      bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return (char *)ctx_local;
      }
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ReadTag
                            ((char *)ctx_local,(uint32_t *)((long)&val + 4),0);
      tag_00 = val._4_4_;
      if (val._4_4_ >> 3 != 1) break;
      if ((val._4_4_ & 0xff) == 8) {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        _internal_set_mode(this,(ReorganizeDataLayerParams_ReorganizationType)uVar2);
      }
      else {
LAB_00318bd8:
        if ((val._4_4_ == 0) || ((val._4_4_ & 7) == 4)) {
          if (ctx_local == (ParseContext *)0x0) {
            return (char *)0x0;
          }
          google::protobuf::internal::EpsCopyInputStream::SetLastTag
                    (&pPStack_20->super_EpsCopyInputStream,val._4_4_);
          return (char *)ctx_local;
        }
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields<std::__cxx11::string>
                            (&(this->super_MessageLite)._internal_metadata_);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::UnknownFieldParse
                              (tag_00,unknown,(char *)ctx_local,pPStack_20);
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
      }
    }
    if ((val._4_4_ >> 3 != 2) || ((val._4_4_ & 0xff) != 0x10)) goto LAB_00318bd8;
    uVar2 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
    this->blocksize_ = uVar2;
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ReorganizeDataLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.ReorganizeDataLayerParams.ReorganizationType mode = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_mode(static_cast<::CoreML::Specification::ReorganizeDataLayerParams_ReorganizationType>(val));
        } else
          goto handle_unusual;
        continue;
      // uint64 blockSize = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          blocksize_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}